

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::~WebSocketResponseImpl
          (WebSocketResponseImpl *this)

{
  anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::~WebSocketResponseImpl
            ((WebSocketResponseImpl *)(this + -8));
  return;
}

Assistant:

WebSocketResponseImpl(kj::Own<kj::PromiseFulfiller<HttpClient::WebSocketResponse>> fulfiller)
        : fulfiller(kj::mv(fulfiller)) {}